

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCPUWarmup.cpp
# Opt level: O0

void tcu::warmupCPU(void)

{
  bool bVar1;
  deUint64 dVar2;
  deUint64 dVar3;
  float fVar4;
  deUint64 startTime_1;
  int measurementNdx;
  deInt64 latestTimes [5];
  float relativeMedianAbsoluteDeviationThreshold;
  int numConsecutiveMeasurementsRequired;
  int maxNumMeasurements;
  deUint64 startTime;
  int i;
  deInt64 times [3];
  int numMeasurements;
  float singleMeasurementThreshold;
  int computationSize;
  float dummy;
  
  singleMeasurementThreshold = *warmupCPUInternal::g_dummy;
  for (numMeasurements = 1; numMeasurements < 0x40000000; numMeasurements = numMeasurements << 1) {
    for (startTime._4_4_ = 0; startTime._4_4_ < 3; startTime._4_4_ = startTime._4_4_ + 1) {
      dVar2 = deGetMicroseconds();
      singleMeasurementThreshold = dummyComputation(singleMeasurementThreshold,numMeasurements);
      dVar3 = deGetMicroseconds();
      *(deUint64 *)(&stack0xffffffffffffffc8 + (long)startTime._4_4_ * 8) = dVar3 - dVar2;
    }
    fVar4 = floatMedian<long,3>((long (*) [3])&stack0xffffffffffffffc8);
    if (10000.0 <= fVar4) break;
  }
  startTime_1._4_4_ = 0;
  while( true ) {
    bVar1 = false;
    if ((startTime_1._4_4_ < 0x32) && (bVar1 = true, 4 < startTime_1._4_4_)) {
      fVar4 = floatRelativeMedianAbsoluteDeviation<long,5>((long (*) [5])&stack0xffffffffffffff78);
      bVar1 = 0.05 < fVar4;
    }
    if (!bVar1) break;
    dVar2 = deGetMicroseconds();
    singleMeasurementThreshold = dummyComputation(singleMeasurementThreshold,numMeasurements);
    dVar3 = deGetMicroseconds();
    *(deUint64 *)(&stack0xffffffffffffff78 + (long)(startTime_1._4_4_ % 5) * 8) = dVar3 - dVar2;
    startTime_1._4_4_ = startTime_1._4_4_ + 1;
  }
  *warmupCPUInternal::g_dummy = singleMeasurementThreshold;
  return;
}

Assistant:

void warmupCPU (void)
{
	float	dummy				= *warmupCPUInternal::g_dummy.m_v;
	int		computationSize		= 1;

	// Do a rough calibration for computationSize to get dummyComputation's running time above a certain threshold.
	while (computationSize < 1<<30) // \note This condition is unlikely to be met. The "real" loop exit is the break below.
	{
		const float		singleMeasurementThreshold	= 10000.0f;
		const int		numMeasurements				= 3;
		deInt64			times[numMeasurements];

		for (int i = 0; i < numMeasurements; i++)
		{
			const deUint64 startTime = deGetMicroseconds();
			dummy = dummyComputation(dummy, computationSize);
			times[i] = (deInt64)(deGetMicroseconds() - startTime);
		}

		if (floatMedian(times) >= singleMeasurementThreshold)
			break;

		computationSize *= 2;
	}

	// Do dummyComputations until running time seems stable enough.
	{
		const int			maxNumMeasurements							= 50;
		const int			numConsecutiveMeasurementsRequired			= 5;
		const float			relativeMedianAbsoluteDeviationThreshold	= 0.05f;
		deInt64				latestTimes[numConsecutiveMeasurementsRequired];

		for (int measurementNdx = 0;

			 measurementNdx < maxNumMeasurements &&
			 (measurementNdx < numConsecutiveMeasurementsRequired ||
			  floatRelativeMedianAbsoluteDeviation(latestTimes) > relativeMedianAbsoluteDeviationThreshold);

			 measurementNdx++)
		{
			const deUint64 startTime = deGetMicroseconds();
			dummy = dummyComputation(dummy, computationSize);
			latestTimes[measurementNdx % numConsecutiveMeasurementsRequired] = (deInt64)(deGetMicroseconds() - startTime);
		}
	}

	*warmupCPUInternal::g_dummy.m_v = dummy;
}